

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O3

REF_STATUS ref_egads_extract_usm3d_mapbc(REF_GEOM ref_geom,char *mapbc)

{
  FILE *__s;
  char *__format;
  
  __s = fopen(mapbc,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",mapbc);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_egads.c",0x11ae,
           "ref_egads_extract_usm3d_mapbc","unable to open file");
    return 2;
  }
  fwrite("# generated from refine with EGADS atrributes\n",0x2e,1,__s);
  fwrite("# bc tags translated from known FUN3D tags when possible\n",0x39,1,__s);
  fwrite("#\n",2,1,__s);
  fwrite("# patch no.     bc      family   surfs    surfids    name\n",0x3a,1,__s);
  if (ref_geom->manifold == 0) {
    if (ref_geom->nedge < 1) {
      fprintf(__s,"%d %d %d %d %d %s\n",(ulong)(ref_geom->nedge + 1),1,1,0,0,"symmetry-y-min");
      fprintf(__s,"%d %d %d %d %d %s\n",(ulong)(ref_geom->nedge + 2),1,1,0,0,"symmetry-y-max");
      goto LAB_001fe365;
    }
    printf("no-op, EGADS not linked with HAVE_EGADS_EFFECTIVE %s\n","ref_egads_get_attribute");
    __format = "bc_name not set for edge %d\n";
  }
  else {
    if (ref_geom->nface < 1) {
LAB_001fe365:
      fclose(__s);
      return 0;
    }
    printf("no-op, EGADS not linked with HAVE_EGADS_EFFECTIVE %s\n","ref_egads_get_attribute");
    __format = "bc_name not set for face %d\n";
  }
  printf(__format,1);
  return 5;
}

Assistant:

REF_FCN REF_STATUS ref_egads_extract_usm3d_mapbc(REF_GEOM ref_geom,
                                                 const char *mapbc) {
  FILE *file;
  REF_INT usm3d_type;
  file = fopen(mapbc, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", mapbc);
  RNS(file, "unable to open file");

  fprintf(file, "# generated from refine with EGADS atrributes\n");
  fprintf(file, "# bc tags translated from known FUN3D tags when possible\n");
  fprintf(file, "#\n");
  fprintf(file, "# patch no.     bc      family   surfs    surfids    name\n");

  if (ref_geom->manifold) {
    REF_INT face_id;
    const char *attribute = NULL;
    for (face_id = 1; face_id <= ref_geom->nface; face_id++) {
      if (REF_SUCCESS != ref_egads_get_attribute(ref_geom, REF_GEOM_FACE,
                                                 face_id, "bc_name",
                                                 &attribute)) {
        printf("bc_name not set for face %d\n", face_id);
        return REF_NOT_FOUND;
      }
    }
    for (face_id = 1; face_id <= ref_geom->nface; face_id++) {
      char *bc_name;
      char *name = NULL;
      REF_SIZE len, i;
      REF_INT bc_type;
      RSS(ref_egads_get_attribute(ref_geom, REF_GEOM_FACE, face_id, "bc_name",
                                  &attribute),
          "get");
      RNS(attribute, "attribute NULL");
      len = strlen(attribute);
      RAS(10000 > len, "attribute more than 10000 bytes");
      ref_malloc(bc_name, (REF_LONG)(len + 1), char);
      strcpy(bc_name, attribute);
      for (i = 0; i < len - 1; i++) {
        if ('_' == bc_name[i]) {
          bc_name[i] = '\n';
          name = &(bc_name[i + 1]);
          break;
        }
      }
      RNS(name, "underscore not found in bc_name");
      bc_type = atoi(bc_name);
      RSS(ref_phys_usm3d_bc_tag(bc_type, &usm3d_type), "usm3d bc tags");
      fprintf(file, "%d %d %d %d %d %s\n", face_id, usm3d_type, usm3d_type, 0,
              0, name);
      ref_free(bc_name);
    }
  } else {
    REF_INT edge_id;
    const char *attribute = NULL;
    for (edge_id = 1; edge_id <= ref_geom->nedge; edge_id++) {
      if (REF_SUCCESS != ref_egads_get_attribute(ref_geom, REF_GEOM_EDGE,
                                                 edge_id, "bc_name",
                                                 &attribute)) {
        printf("bc_name not set for edge %d\n", edge_id);
        return REF_NOT_FOUND;
      }
    }
    for (edge_id = 1; edge_id <= ref_geom->nedge; edge_id++) {
      char *bc_name;
      char *name = NULL;
      REF_SIZE len, i;
      REF_INT bc_type;
      RSS(ref_egads_get_attribute(ref_geom, REF_GEOM_EDGE, edge_id, "bc_name",
                                  &attribute),
          "get");
      RNS(attribute, "attribute NULL");
      len = strlen(attribute);
      RAS(10000 > len, "attribute more than 10000 bytes");
      ref_malloc(bc_name, (REF_LONG)(len + 1), char);
      strcpy(bc_name, attribute);
      for (i = 0; i < len; i++) {
        if ('_' == bc_name[i]) {
          bc_name[i] = '\n';
          name = &(bc_name[i + 1]);
          break;
        }
      }
      RNS(name, "underscore not found in bc_name");
      bc_type = atoi(bc_name);
      RSS(ref_phys_usm3d_bc_tag(bc_type, &usm3d_type), "usm3d bc tags");
      fprintf(file, "%d %d %d %d %d %s\n", edge_id, usm3d_type, usm3d_type, 0,
              0, name);
      ref_free(bc_name);
    }
    usm3d_type = 1; /* y symmetry */
    edge_id = ref_geom->nedge + 1;
    fprintf(file, "%d %d %d %d %d %s\n", edge_id, usm3d_type, usm3d_type, 0, 0,
            "symmetry-y-min");
    edge_id = ref_geom->nedge + 2;
    fprintf(file, "%d %d %d %d %d %s\n", edge_id, usm3d_type, usm3d_type, 0, 0,
            "symmetry-y-max");
  }
  fclose(file);

  return REF_SUCCESS;
}